

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  char *pcVar1;
  ostream *local_1e8;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream aoStack_1a0 [376];
  FILE *local_28;
  FILE *jsonout;
  UnitTest *pUStack_18;
  int param_2_local;
  UnitTest *unit_test_local;
  JsonUnitTestResultPrinter *this_local;
  
  jsonout._4_4_ = param_2;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  local_28 = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1e8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1b0) {
    local_1e8 = aoStack_1a0;
  }
  PrintJsonUnitTest(local_1e8,pUStack_18);
  __stream = local_28;
  StringStreamToString(&local_1e0,(stringstream *)local_1b0);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_1e0);
  fprintf(__stream,"%s",pcVar1);
  std::__cxx11::string::~string((string *)&local_1e0);
  fclose(local_28);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                   int /*iteration*/) {
  FILE* jsonout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}